

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceDefinition::ShaderSet::ShaderSet
          (ShaderSet *this,SharedPtr *enclosing,GLSLVersion version,deUint32 stagesPresentBits,
          deUint32 stagesReferencingBits)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  deUint32 stageNdx;
  long lVar3;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
  (this->super_Node).m_type = TYPE_SHADER_SET;
  (this->super_Node).m_enclosingNode.m_ptr = enclosing->m_ptr;
  pSVar2 = enclosing->m_state;
  (this->super_Node).m_enclosingNode.m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->super_Node).m_enclosingNode.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Node_021a73a0;
  this->m_version = version;
  lVar3 = 0;
  do {
    this->m_stagePresent[lVar3] = (stagesPresentBits >> ((uint)lVar3 & 0x1f) & 1) != 0;
    this->m_stageReferencing[lVar3] = (stagesReferencingBits >> ((uint)lVar3 & 0x1f) & 1) != 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  return;
}

Assistant:

Node				(NodeType type, const SharedPtr& enclosingNode) : m_type(type), m_enclosingNode(enclosingNode) { DE_ASSERT(type < TYPE_LAST); }